

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops_sse.h
# Opt level: O2

void helper_psllq_xmm_x86_64(CPUX86State *env,ZMMReg *d,ZMMReg *s)

{
  if (0x3f < s->_q_ZMMReg[0]) {
    d->_q_ZMMReg[0] = 0;
    d->_q_ZMMReg[1] = 0;
    return;
  }
  d->_q_ZMMReg[0] = d->_q_ZMMReg[0] << s->_q_ZMMReg[0];
  d->_q_ZMMReg[1] = d->_q_ZMMReg[1];
  return;
}

Assistant:

void glue(helper_psllq, SUFFIX)(CPUX86State *env, Reg *d, Reg *s)
{
    int shift;

    if (s->Q(0) > 63) {
        d->Q(0) = 0;
#if SHIFT == 1
        d->Q(1) = 0;
#endif
    } else {
        shift = s->B(0);
        d->Q(0) <<= shift;
#if SHIFT == 1
        d->Q(1) <<= shift;
#endif
    }
}